

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * validateEmbeddingWeightsBias
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
                   WeightParams *bias)

{
  int iVar1;
  ConvolutionLayerParams *pCVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  string *psVar6;
  uint uVar7;
  char cVar8;
  bool bVar9;
  long *plVar10;
  char cVar11;
  long *plVar12;
  size_type *psVar13;
  uint64_t uVar14;
  byte bVar15;
  uint uVar16;
  long lVar17;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string layer_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_e0;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  uint64_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  CoreML::Result::Result(__return_storage_ptr__);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if (layer->_oneof_case_[0] == 0x410) {
    pCVar2 = (layer->layer_).convolution_;
    lVar17 = *(long *)&pCVar2->_kernelsize_cached_byte_size_;
    uVar14._0_4_ = (pCVar2->stride_).current_size_;
    uVar14._4_4_ = (pCVar2->stride_).total_size_;
    bVar15 = *(byte *)&(pCVar2->stride_).rep_;
    std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,0x62f703);
  }
  else {
    if (layer->_oneof_case_[0] != 0x96) goto LAB_005494b9;
    pCVar2 = (layer->layer_).convolution_;
    lVar17 = *(long *)&pCVar2->_kernelsize_cached_byte_size_;
    uVar14._0_4_ = (pCVar2->stride_).current_size_;
    uVar14._4_4_ = (pCVar2->stride_).total_size_;
    bVar15 = *(byte *)&(pCVar2->stride_).rep_;
    std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,0x624d27);
  }
  iVar1 = (weights->floatvalue_).current_size_;
  sVar3 = ((weights->float16value_).ptr_)->_M_string_length;
  uVar16 = (0 < iVar1) + 1;
  if (sVar3 == 0) {
    uVar16 = (uint)(0 < iVar1);
  }
  sVar4 = ((weights->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((weights->int8rawvalue_).ptr_)->_M_string_length;
  uVar7 = (uint)(sVar5 == 0);
  uVar16 = (uVar16 - (sVar4 == 0)) + 2;
  cVar8 = '\x04';
  cVar11 = '\x04';
  if (uVar16 - uVar7 < 2) {
    cVar11 = '\x05';
    if (uVar16 != uVar7) {
      cVar11 = iVar1 < 1;
    }
    if (((((sVar3 == 0) && (iVar1 < 1)) && (uVar16 != uVar7)) &&
        (((sVar4 == 0 ||
          (weights == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (cVar11 = '\x02', weights->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 ||
         (weights == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
        (cVar11 = '\x03', weights->quantization_ == (QuantizationParams *)0x0)))) {
      cVar11 = '\x05';
    }
  }
  iVar1 = (bias->floatvalue_).current_size_;
  sVar3 = ((bias->float16value_).ptr_)->_M_string_length;
  uVar16 = (0 < iVar1) + 1;
  if (sVar3 == 0) {
    uVar16 = (uint)(0 < iVar1);
  }
  sVar4 = ((bias->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((bias->int8rawvalue_).ptr_)->_M_string_length;
  uVar7 = (uint)(sVar5 == 0);
  uVar16 = (uVar16 - (sVar4 == 0)) + 2;
  if (uVar16 - uVar7 < 2) {
    cVar8 = '\x05';
    if (uVar16 != uVar7) {
      cVar8 = iVar1 < 1;
    }
    if ((((sVar3 == 0) && (iVar1 < 1)) && (uVar16 != uVar7)) &&
       ((((sVar4 == 0 ||
          (bias == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (cVar8 = '\x02', bias->quantization_ == (QuantizationParams *)0x0)) &&
        (((sVar5 == 0 ||
          (bias == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (cVar8 = '\x03', bias->quantization_ == (QuantizationParams *)0x0)))))) {
      cVar8 = '\x05';
    }
  }
  if ((cVar11 == '\x04') || ((cVar8 == '\x04' & bVar15) != 0)) {
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)&local_98);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_98,(ulong)(((layer->name_).ptr_)->_M_dataplus)._M_p)
    ;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar13) {
      local_b0 = *psVar13;
      aStack_a8._M_allocated_capacity = plVar10[3];
      local_c0 = (undefined1  [8])&local_b0;
    }
    else {
      local_b0 = *psVar13;
      local_c0 = (undefined1  [8])*plVar10;
    }
    local_b8._M_p = (pointer)plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append(local_c0);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0.field_2._8_8_ = plVar10[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_e0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if (local_c0 != (undefined1  [8])&local_b0) {
      operator_delete((void *)local_c0,local_b0 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    CoreML::Result::Result((Result *)local_c0,INVALID_MODEL_PARAMETERS,&local_e0);
    __return_storage_ptr__->m_type = local_c0._0_4_;
    __return_storage_ptr__->m_reason = local_c0._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &aStack_a8) {
      operator_delete(local_b8._M_p,aStack_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  else if ((bVar15 == 0) ||
          (((cVar11 != '\x01' || (cVar8 != '\0')) && ((cVar11 != '\0' || (cVar8 != '\x01')))))) {
    psVar6 = (layer->name_).ptr_;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_58 = uVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"weight","");
    CoreML::validateGeneralWeightParams
              ((Result *)local_c0,weights,lVar17 * local_58,local_58,&local_78,psVar6,&local_e0);
    __return_storage_ptr__->m_type = local_c0._0_4_;
    __return_storage_ptr__->m_reason = local_c0._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &aStack_a8) {
      operator_delete(local_b8._M_p,aStack_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar9 = CoreML::Result::good(__return_storage_ptr__);
    if ((bVar9 & bVar15) != 0) {
      psVar6 = (layer->name_).ptr_;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"bias","");
      CoreML::validateGeneralWeightParams
                ((Result *)local_c0,bias,local_58,1,&local_78,psVar6,&local_e0);
      __return_storage_ptr__->m_type = local_c0._0_4_;
      __return_storage_ptr__->m_reason = local_c0._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->m_message,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &aStack_a8) {
        operator_delete(local_b8._M_p,aStack_a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      CoreML::Result::good(__return_storage_ptr__);
    }
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)local_50);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)local_50,(ulong)(((layer->name_).ptr_)->_M_dataplus)._M_p);
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_88 = *plVar12;
      lStack_80 = plVar10[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar12;
      local_98 = (long *)*plVar10;
    }
    local_90 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0.field_2._8_8_ = plVar10[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_e0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CoreML::Result::Result((Result *)local_c0,INVALID_MODEL_PARAMETERS,&local_e0);
    __return_storage_ptr__->m_type = local_c0._0_4_;
    __return_storage_ptr__->m_reason = local_c0._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &aStack_a8) {
      operator_delete(local_b8._M_p,aStack_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
LAB_005494b9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Result validateEmbeddingWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {

    Result r;

    bool has_bias;
    uint64_t input_dim;
    uint64_t output_channels;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding: {
            const auto& params = layer.embedding();
            input_dim = params.inputdim();
            output_channels = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Embedding";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kEmbeddingND: {
            const auto& params = layer.embeddingnd();
            input_dim = params.vocabsize();
            output_channels = params.embeddingsize();
            has_bias = params.hasbias();
            layer_type = "EmbeddingND";
            break;
        }
        default:
            return r;
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)){
        std::string err = layer_type + " '" + layer.name() + "' has invalid weights/bias fields. Field value types should match and should either be half or full precision.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }
    // Validate weight and bias sizes
    r = validateGeneralWeightParams(weights, input_dim * output_channels, output_channels,
                                    layer_type, layer.name(), "weight");
    if (!r.good()) return r;
    if (has_bias){
        r = validateGeneralWeightParams(bias, output_channels, 1,
                                        layer_type, layer.name(), "bias");
        if (!r.good()) return r;
    }

    return r;
}